

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_future.cpp
# Opt level: O1

Read<double> __thiscall Omega_h::Future<double>::get(Future<double> *this)

{
  int *piVar1;
  Alloc *pAVar2;
  undefined8 uVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar4;
  long in_RSI;
  Read<double> RVar5;
  Write<double> local_20;
  
  if (*(int *)(in_RSI + 0x58) != 1) {
    fail("Can not ask the result more than once.");
  }
  *(undefined4 *)(in_RSI + 0x58) = 2;
  local_20.shared_alloc_.alloc = *(Alloc **)(in_RSI + 0x10);
  if (((ulong)local_20.shared_alloc_.alloc & 7) == 0 && local_20.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_20.shared_alloc_.alloc = (Alloc *)((local_20.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_20.shared_alloc_.alloc)->use_count = (local_20.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_20.shared_alloc_.direct_ptr = *(void **)(in_RSI + 0x18);
  if (*(long *)(in_RSI + 0x30) != 0) {
    (**(code **)(in_RSI + 0x38))(this,in_RSI + 0x20,&local_20);
    pAVar2 = local_20.shared_alloc_.alloc;
    pvVar4 = extraout_RDX;
    if (((ulong)local_20.shared_alloc_.alloc & 7) == 0 &&
        local_20.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_20.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_20.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar4 = extraout_RDX_00;
      }
    }
    RVar5.write_.shared_alloc_.direct_ptr = pvVar4;
    RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<double>)RVar5.write_.shared_alloc_;
  }
  uVar3 = std::__throw_bad_function_call();
  Write<double>::~Write(&local_20);
  _Unwind_Resume(uVar3);
}

Assistant:

Read<T> Future<T>::get() {
  if (status_ == Status::completed) {
    status_ = Status::consumed;
    return callback_(recvbuf_);
#ifdef OMEGA_H_USE_MPI
  } else if (status_ == Status::waiting) {
    OMEGA_H_CHECK(MPI_SUCCESS == MPI_Waitall(static_cast<int>(requests_.size()),
                                     requests_.data(), MPI_STATUS_IGNORE));
    status_ = Status::consumed;
    return callback_(recvbuf_);
#endif  // !OMEGA_H_USE_MPI
  } else {
    fail("Can not ask the result more than once.");
  }
}